

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jacobi.h
# Opt level: O0

void Eigen::internal::apply_rotation_in_the_plane_selector<float,_float,_3,_0,_false>::run
               (float *x,Index incrx,float *y,Index incry,Index size,float c,float s)

{
  float fVar1;
  float fVar2;
  float fVar3;
  type tVar4;
  float yi;
  float xi;
  Index i;
  float s_local;
  float c_local;
  Index size_local;
  Index incry_local;
  float *y_local;
  Index incrx_local;
  float *x_local;
  
  i._0_4_ = s;
  i._4_4_ = c;
  _s_local = size;
  size_local = incry;
  incry_local = (Index)y;
  y_local = (float *)incrx;
  incrx_local = (Index)x;
  for (_yi = 0; fVar3 = i._4_4_, _yi < _s_local; _yi = _yi + 1) {
    fVar1 = *(float *)incrx_local;
    fVar2 = *(float *)incry_local;
    tVar4 = numext::conj<float>((float *)&i);
    *(float *)incrx_local = fVar3 * fVar1 + tVar4 * fVar2;
    fVar3 = -(float)i;
    tVar4 = numext::conj<float>((float *)((long)&i + 4));
    *(float *)incry_local = fVar3 * fVar1 + tVar4 * fVar2;
    incrx_local = (long)y_local * 4 + incrx_local;
    incry_local = size_local * 4 + incry_local;
  }
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC
  inline void run(Scalar *x, Index incrx, Scalar *y, Index incry, Index size, OtherScalar c, OtherScalar s)
  {
    for(Index i=0; i<size; ++i)
    {
      Scalar xi = *x;
      Scalar yi = *y;
      *x =  c * xi + numext::conj(s) * yi;
      *y = -s * xi + numext::conj(c) * yi;
      x += incrx;
      y += incry;
    }
  }